

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easygetopt.c
# Opt level: O0

curl_easyoption * curl_easy_option_next(curl_easyoption *prev)

{
  curl_easyoption *prev_local;
  
  if ((prev == (curl_easyoption *)0x0) || (prev->name == (char *)0x0)) {
    if (prev == (curl_easyoption *)0x0) {
      prev_local = Curl_easyopts;
      return prev_local;
    }
  }
  else if (prev[1].name != (char *)0x0) {
    return prev + 1;
  }
  return (curl_easyoption *)0x0;
}

Assistant:

const struct curl_easyoption *
curl_easy_option_next(const struct curl_easyoption *prev)
{
  if(prev && prev->name) {
    prev++;
    if(prev->name)
      return prev;
  }
  else if(!prev)
    return &Curl_easyopts[0];
  return NULL;
}